

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O2

Token __thiscall flowtest::Lexer::parseNumber(Lexer *this)

{
  pointer pcVar1;
  ulong uVar2;
  uint uVar3;
  
  this->numberValue_ = 0;
  while ((uVar2 = (ulong)(this->currentPos_).offset, (this->source_)._M_string_length != uVar2 &&
         (pcVar1 = (this->source_)._M_dataplus._M_p, (int)pcVar1[uVar2] - 0x30U < 10))) {
    uVar3 = this->numberValue_ * 10;
    this->numberValue_ = uVar3;
    this->numberValue_ = ((int)pcVar1[uVar2] + uVar3) - 0x30;
    nextChar(this,1);
  }
  return Number;
}

Assistant:

Token Lexer::parseNumber() {
  numberValue_ = 0;

  while (std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    nextChar();
  }
  return Token::Number;
}